

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall Highs::addVars(Highs *this,HighsInt num_new_var,double *lower,double *upper)

{
  HighsStatus HVar1;
  vector<double,_std::allocator<double>_> cost;
  _Vector_base<double,_std::allocator<double>_> local_48;
  value_type_conflict1 local_28;
  
  logHeader(this);
  if (num_new_var < 1) {
    returnFromHighs(this,kOk);
  }
  local_48._M_impl.super__Vector_impl_data._M_start = (double *)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28 = 0.0;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            ((vector<double,_std::allocator<double>_> *)&local_48,(long)num_new_var,&local_28);
  HVar1 = addCols(this,num_new_var,local_48._M_impl.super__Vector_impl_data._M_start,lower,upper,0,
                  (HighsInt *)0x0,(HighsInt *)0x0,(double *)0x0);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  return HVar1;
}

Assistant:

HighsStatus Highs::addVars(const HighsInt num_new_var, const double* lower,
                           const double* upper) {
  this->logHeader();
  HighsStatus return_status = HighsStatus::kOk;
  // Avoid touching entry [0] of a vector of size 0
  if (num_new_var <= 0) returnFromHighs(return_status);
  std::vector<double> cost;
  cost.assign(num_new_var, 0);
  return addCols(num_new_var, cost.data(), lower, upper, 0, nullptr, nullptr,
                 nullptr);
}